

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

ProString * __thiscall
ProString::append(ProString *this,ProStringList *other,bool *pending,bool skipEmpty1st)

{
  qsizetype qVar1;
  ProString *pPVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (int)(other->super_QList<ProString>).d.size;
  if (iVar8 != 0) {
    uVar5 = 0;
    if ((((pending != (bool *)0x0) && (skipEmpty1st)) && (*pending == false)) &&
       (((other->super_QList<ProString>).d.ptr)->m_length == 0)) {
      if (iVar8 == 1) goto LAB_00212002;
      uVar5 = 1;
    }
    if (uVar5 + 1 == iVar8 && this->m_length == 0) {
      operator=(this,(other->super_QList<ProString>).d.ptr + uVar5);
    }
    else {
      if (pending == (bool *)0x0) {
        bVar7 = 0;
      }
      else {
        bVar7 = (*pending ^ 1U) & this->m_length != 0;
      }
      toQString((QString *)&local_58,this);
      pDVar3 = (this->m_string).d.d;
      pcVar4 = (this->m_string).d.ptr;
      (this->m_string).d.d = local_58.d;
      (this->m_string).d.ptr = local_58.ptr;
      qVar1 = (this->m_string).d.size;
      (this->m_string).d.size = local_58.size;
      local_58.d = pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      this->m_offset = 0;
      uVar9 = (ulong)uVar5;
      lVar6 = uVar9 * 0x30 + 0x1c;
      for (; (long)uVar9 < (long)iVar8; uVar9 = uVar9 + 1) {
        if (bVar7 != 0) {
          QString::append((QChar)(char16_t)this);
        }
        pPVar2 = (other->super_QList<ProString>).d.ptr;
        local_58.ptr = *(char16_t **)((long)pPVar2 + lVar6 + -0x14);
        local_58.d = *(Data **)((long)pPVar2 + lVar6 + -0xc);
        QVar10 = QStringView::mid((QStringView *)&local_58,(long)*(int *)((long)pPVar2 + lVar6 + -4)
                                  ,(long)*(int *)((long)&(pPVar2->m_string).d.d + lVar6));
        QString::append((QChar *)this,(longlong)QVar10.m_data);
        lVar6 = lVar6 + 0x30;
        bVar7 = 1;
      }
      this->m_length = (int)(this->m_string).d.size;
      iVar8 = (other->super_QList<ProString>).d.ptr[(other->super_QList<ProString>).d.size + -1].
              m_file;
      if (iVar8 != 0) {
        this->m_file = iVar8;
      }
      this->m_hash = 0x80000000;
    }
    if (pending != (bool *)0x0) {
      *pending = true;
    }
  }
LAB_00212002:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProString &ProString::append(const ProStringList &other, bool *pending, bool skipEmpty1st)
{
    if (const int sz = other.size()) {
        int startIdx = 0;
        if (pending && !*pending && skipEmpty1st && other.at(0).isEmpty()) {
            if (sz == 1)
                return *this;
            startIdx = 1;
        }
        if (!m_length && sz == startIdx + 1) {
            *this = other.at(startIdx);
        } else {
            bool putSpace = false;
            if (pending && !*pending && m_length)
                putSpace = true;

            m_string = toQString();
            m_offset = 0;
            for (int i = startIdx; i < sz; ++i) {
                if (putSpace)
                    m_string += QLatin1Char(' ');
                else
                    putSpace = true;
                const ProString &str = other.at(i);
                m_string += str.toQStringView();
            }
            m_length = m_string.size();
            if (other.last().m_file)
                m_file = other.last().m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}